

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ratio.cpp
# Opt level: O3

bool __thiscall Ratio::containsOriginalEEdge(Ratio *this,Bipartition *edge)

{
  PhyloTreeEdge *pPVar1;
  pointer pPVar2;
  bool bVar3;
  PhyloTreeEdge *ratio_edge;
  PhyloTreeEdge *this_00;
  pointer this_01;
  Bipartition *local_40;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  this_00 = (this->eEdges).super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl
            .super__Vector_impl_data._M_start;
  pPVar1 = (this->eEdges).super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
           super__Vector_impl_data._M_finish;
  while( true ) {
    if (this_00 == pPVar1) {
      this_01 = (this->fEdges).super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>.
                _M_impl.super__Vector_impl_data._M_start;
      pPVar2 = (this->fEdges).super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      if (this_01 == pPVar2) {
        bVar3 = false;
      }
      else {
        do {
          PhyloTreeEdge::getOriginalEdge(this_01);
          bVar3 = Bipartition::equals(local_40,edge);
          if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
          }
          this_01 = this_01 + 1;
        } while (this_01 != pPVar2 && !bVar3);
      }
      return bVar3;
    }
    PhyloTreeEdge::getOriginalEdge(this_00);
    bVar3 = Bipartition::equals(local_40,edge);
    if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
    }
    if (bVar3) break;
    this_00 = this_00 + 1;
  }
  return true;
}

Assistant:

bool Ratio::containsOriginalEEdge(const Bipartition &edge) {

    for (PhyloTreeEdge &ratio_edge : eEdges) {
        if (ratio_edge.getOriginalEdge()->equals(edge)) {
            return true;
        }
    }

    for (PhyloTreeEdge &ratio_edge : fEdges) {
        if (ratio_edge.getOriginalEdge()->equals(edge)) {
            return true;
        }
    }
    return false;
}